

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O2

int __thiscall ncnn::Gemm_x86_fma::create_pipeline(Gemm_x86_fma *this,Option *opt)

{
  Mat *dst;
  Allocator *pAVar1;
  void *pvVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int *piVar9;
  _func_int **pp_Var10;
  int iVar11;
  _func_int *p_Var12;
  int iVar13;
  int max_kk;
  int iVar14;
  ulong uVar15;
  int iVar16;
  _func_int *p_Var17;
  int max_ii;
  int iVar18;
  Mat local_b8;
  ulong local_68;
  int local_5c;
  int local_58;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Option *local_48;
  ulong local_40;
  ulong local_38;
  
  pp_Var10 = this->_vptr_Gemm_x86_fma;
  p_Var17 = pp_Var10[-3];
  local_48 = opt;
  if (*(int *)(p_Var17 + 0x40 + (long)&(this->CT_data).data) == 0) {
LAB_00467cc2:
    if (*(int *)(p_Var17 + 0x44 + (long)&(this->CT_data).data) != 0) {
      iVar7 = *(int *)(&this->field_0xf0 + (long)p_Var17);
      uVar6 = *(uint *)(&this->field_0xf4 + (long)p_Var17);
      get_optimal_tile_mnk
                (0,iVar7,uVar6,*(int *)(&this->field_0x10c + (long)p_Var17),
                 *(int *)(&this->field_0x110 + (long)p_Var17),
                 *(int *)(&this->field_0x114 + (long)p_Var17),&TILE_M,&TILE_N,&TILE_K,
                 opt->num_threads);
      iVar18 = (iVar7 + TILE_N + -1) / TILE_N;
      iVar5 = (int)(TILE_K + uVar6 + -1) / TILE_K;
      local_68 = (ulong)uVar6;
      Mat::create(&this->BT_data,TILE_K * TILE_N,iVar5,iVar18,4,(Allocator *)0x0);
      if (((this->BT_data).data == (void *)0x0) ||
         ((long)(this->BT_data).c * (this->BT_data).cstep == 0)) goto LAB_00467e82;
      iVar18 = iVar18 * iVar5;
      iVar14 = 0;
      if (iVar18 < 1) {
        iVar18 = iVar14;
      }
      for (; opt = local_48, iVar18 != iVar14; iVar14 = iVar14 + 1) {
        iVar16 = TILE_N * (iVar14 / iVar5);
        iVar13 = TILE_K * (int)((long)iVar14 % (long)iVar5);
        iVar11 = iVar7 - iVar16;
        if (TILE_N < iVar7 - iVar16) {
          iVar11 = TILE_N;
        }
        max_kk = (int)local_68 - iVar13;
        if (TILE_K < max_kk) {
          max_kk = TILE_K;
        }
        local_b8.w = (this->BT_data).w;
        local_b8.cstep = (size_t)local_b8.w;
        local_b8.elemsize = (this->BT_data).elemsize;
        local_b8.elempack = (this->BT_data).elempack;
        local_b8.data =
             (void *)((long)(this->BT_data).data +
                     ((long)iVar14 % (long)iVar5 & 0xffffffffU) * local_b8.cstep * local_b8.elemsize
                     + (long)(iVar14 / iVar5) * (this->BT_data).cstep * local_b8.elemsize);
        local_b8.allocator = (this->BT_data).allocator;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.dims = 2;
        local_b8.h = 1;
        local_b8.d = 1;
        local_b8.c = 1;
        if (*(int *)(this->_vptr_Gemm_x86_fma[-3] + 0x3c + (long)&(this->CT_data).data) == 0) {
          transpose_pack_B_tile
                    ((Mat *)(&this->field_0x160 + (long)this->_vptr_Gemm_x86_fma[-3]),&local_b8,
                     iVar16,iVar11,iVar13,max_kk);
        }
        else {
          pack_B_tile((Mat *)(&this->field_0x160 + (long)this->_vptr_Gemm_x86_fma[-3]),&local_b8,
                      iVar16,iVar11,iVar13,max_kk);
        }
      }
      pp_Var10 = this->_vptr_Gemm_x86_fma;
      if (local_48->lightmode != false) {
        p_Var17 = pp_Var10[-3];
        piVar9 = *(int **)(&this->field_0x168 + (long)p_Var17);
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + -1;
          UNLOCK();
          if (*piVar9 == 0) {
            if (*(long **)(&this->field_0x180 + (long)p_Var17) == (long *)0x0) {
              free(*(void **)(&this->field_0x160 + (long)p_Var17));
            }
            else {
              (**(code **)(**(long **)(&this->field_0x180 + (long)p_Var17) + 0x18))();
            }
          }
        }
        *(undefined8 *)(&this->field_0x1a0 + (long)p_Var17) = 0;
        *(undefined8 *)(&this->field_0x16c + (long)p_Var17) = 0;
        *(undefined8 *)(&this->field_0x174 + (long)p_Var17) = 0;
        *(undefined8 *)(&this->field_0x160 + (long)p_Var17) = 0;
        *(undefined8 *)(&this->field_0x168 + (long)p_Var17) = 0;
        *(undefined8 *)(&this->field_0x188 + (long)p_Var17) = 0;
        *(undefined8 *)(&this->field_0x190 + (long)p_Var17) = 0;
        *(undefined4 *)(&this->field_0x198 + (long)p_Var17) = 0;
        pp_Var10 = this->_vptr_Gemm_x86_fma;
      }
      p_Var17 = pp_Var10[-3];
    }
    if ((*(int *)(&this->field_0xe8 + (long)p_Var17) != 0) &&
       (iVar7 = *(int *)(&this->field_0xf8 + (long)p_Var17), iVar7 != -1)) {
      dst = &this->CT_data;
      p_Var12 = (_func_int *)0xfffffffffffffef8;
      if (p_Var17 != (_func_int *)0xfffffffffffffef8) {
        piVar9 = *(int **)(&this->field_0x1b0 + (long)p_Var17);
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + 1;
          UNLOCK();
        }
        piVar9 = (this->CT_data).refcount;
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + -1;
          UNLOCK();
          if (*piVar9 == 0) {
            pAVar1 = (this->CT_data).allocator;
            if (pAVar1 == (Allocator *)0x0) {
              free((this->CT_data).data);
            }
            else {
              (*pAVar1->_vptr_Allocator[3])();
            }
          }
        }
        (this->CT_data).cstep = 0;
        *(undefined8 *)((long)&(this->CT_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->CT_data).elemsize + 4) = 0;
        dst->data = (void *)0x0;
        (this->CT_data).refcount = (int *)0x0;
        (this->CT_data).dims = 0;
        (this->CT_data).w = 0;
        (this->CT_data).h = 0;
        (this->CT_data).d = 0;
        (this->CT_data).c = 0;
        piVar9 = *(int **)((long)(&this->field_0x1a8 + (long)p_Var17) + 8);
        (this->CT_data).data = *(void **)(&this->field_0x1a8 + (long)p_Var17);
        (this->CT_data).refcount = piVar9;
        (this->CT_data).elemsize = *(size_t *)(&this->field_0x1b8 + (long)p_Var17);
        (this->CT_data).elempack = *(int *)(&this->field_0x1c0 + (long)p_Var17);
        (this->CT_data).allocator = *(Allocator **)(&this->field_0x1c8 + (long)p_Var17);
        uVar3 = *(undefined8 *)(&this->field_0x1d0 + (long)p_Var17);
        uVar4 = *(undefined8 *)((long)(&this->field_0x1d0 + (long)p_Var17) + 8);
        (this->CT_data).dims = (int)uVar3;
        (this->CT_data).w = (int)((ulong)uVar3 >> 0x20);
        (this->CT_data).h = (int)uVar4;
        (this->CT_data).d = (int)((ulong)uVar4 >> 0x20);
        (this->CT_data).c = *(int *)(&this->field_0x1e0 + (long)p_Var17);
        (this->CT_data).cstep = *(size_t *)(&this->field_0x1e8 + (long)p_Var17);
        pp_Var10 = this->_vptr_Gemm_x86_fma;
        p_Var12 = pp_Var10[-3];
        iVar7 = *(int *)(&this->field_0xf8 + (long)p_Var12);
      }
      if ((iVar7 == 3) && (opt->use_packing_layout == true)) {
        iVar7 = 8;
        if ((*(uint *)(&this->field_0xec + (long)p_Var12) & 7) != 0) {
          iVar7 = (uint)((*(uint *)(&this->field_0xec + (long)p_Var12) & 3) == 0) * 3 + 1;
        }
        convert_packing((Mat *)(&this->field_0x1a8 + (long)p_Var12),dst,iVar7,opt);
        pp_Var10 = this->_vptr_Gemm_x86_fma;
        p_Var12 = pp_Var10[-3];
      }
      if (*(float *)(p_Var12 + 0x34 + (long)&(this->CT_data).data) != 1.0) {
        local_b8.cstep = 0;
        local_b8.data = (void *)0x0;
        local_b8.refcount._0_4_ = 0;
        local_b8.refcount._4_4_ = 0;
        local_b8.elemsize = SUB128(ZEXT812(0),4);
        local_b8.elempack = 0;
        local_b8.allocator = (Allocator *)0x0;
        local_b8.dims = 0;
        local_b8.c = 0;
        uVar15 = 0;
        local_b8.w = local_b8.refcount._4_4_;
        local_b8._48_8_ = local_b8.elemsize;
        Mat::create_like(&local_b8,dst,(Allocator *)0x0);
        uVar6 = (this->CT_data).c * (int)(this->CT_data).cstep * (this->CT_data).elempack;
        pp_Var10 = this->_vptr_Gemm_x86_fma;
        pvVar2 = (this->CT_data).data;
        uVar8 = (ulong)uVar6;
        if ((int)uVar6 < 1) {
          uVar8 = uVar15;
        }
        for (; uVar8 != uVar15; uVar15 = uVar15 + 1) {
          *(float *)((long)local_b8.data + uVar15 * 4) =
               *(float *)(pp_Var10[-3] + 0x34 + (long)&(this->CT_data).data) *
               *(float *)((long)pvVar2 + uVar15 * 4);
        }
        piVar9 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
        if (dst != &local_b8) {
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + 1;
            UNLOCK();
          }
          piVar9 = (this->CT_data).refcount;
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + -1;
            UNLOCK();
            if (*piVar9 == 0) {
              pAVar1 = (this->CT_data).allocator;
              if (pAVar1 == (Allocator *)0x0) {
                free((this->CT_data).data);
              }
              else {
                (*pAVar1->_vptr_Allocator[3])();
              }
            }
          }
          piVar9 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
          (this->CT_data).data = local_b8.data;
          (this->CT_data).refcount =
               (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
          (this->CT_data).elemsize = local_b8.elemsize;
          (this->CT_data).elempack = local_b8.elempack;
          (this->CT_data).allocator = local_b8.allocator;
          (this->CT_data).dims = local_b8.dims;
          (this->CT_data).w = local_b8.w;
          (this->CT_data).h = local_b8.h;
          (this->CT_data).d = local_b8.d;
          (this->CT_data).c = local_b8.c;
          (this->CT_data).cstep = local_b8.cstep;
        }
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + -1;
          UNLOCK();
          if (*piVar9 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) {
              free(local_b8.data);
            }
            else {
              (*(local_b8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pp_Var10 = this->_vptr_Gemm_x86_fma;
      }
      if (opt->lightmode == true) {
        p_Var17 = pp_Var10[-3];
        piVar9 = *(int **)(&this->field_0x1b0 + (long)p_Var17);
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + -1;
          UNLOCK();
          if (*piVar9 == 0) {
            if (*(long **)(&this->field_0x1c8 + (long)p_Var17) == (long *)0x0) {
              free(*(void **)(&this->field_0x1a8 + (long)p_Var17));
            }
            else {
              (**(code **)(**(long **)(&this->field_0x1c8 + (long)p_Var17) + 0x18))();
            }
          }
        }
        *(undefined8 *)(&this->field_0x1e8 + (long)p_Var17) = 0;
        *(undefined8 *)(&this->field_0x1b4 + (long)p_Var17) = 0;
        *(undefined8 *)(&this->field_0x1bc + (long)p_Var17) = 0;
        *(undefined8 *)(&this->field_0x1a8 + (long)p_Var17) = 0;
        *(undefined8 *)(&this->field_0x1b0 + (long)p_Var17) = 0;
        *(undefined8 *)(&this->field_0x1d0 + (long)p_Var17) = 0;
        *(undefined8 *)(&this->field_0x1d8 + (long)p_Var17) = 0;
        *(undefined4 *)(&this->field_0x1e0 + (long)p_Var17) = 0;
        pp_Var10 = this->_vptr_Gemm_x86_fma;
      }
    }
    p_Var17 = pp_Var10[-3];
    if (((*(int *)(p_Var17 + 0x40 + (long)&(this->CT_data).data) != 0) ||
        (*(int *)(p_Var17 + 0x44 + (long)&(this->CT_data).data) != 0)) ||
       (*(int *)(&this->field_0xe8 + (long)p_Var17) != 0)) {
      this->nT = opt->num_threads;
    }
    iVar7 = 0;
  }
  else {
    uVar6 = *(uint *)(&this->field_0xec + (long)p_Var17);
    iVar7 = *(int *)(&this->field_0xf4 + (long)p_Var17);
    get_optimal_tile_mnk
              (uVar6,0,iVar7,*(int *)(&this->field_0x10c + (long)p_Var17),
               *(int *)(&this->field_0x110 + (long)p_Var17),
               *(int *)(&this->field_0x114 + (long)p_Var17),&TILE_M,&TILE_N,&TILE_K,opt->num_threads
              );
    iVar5 = TILE_K;
    local_40 = (ulong)(uint)TILE_M;
    iVar18 = (int)(uVar6 + TILE_M + -1) / TILE_M;
    local_38 = (ulong)uVar6;
    Mat::create(&this->AT_data,TILE_K * TILE_M,(iVar7 + -1 + TILE_K) / TILE_K,iVar18,4,
                (Allocator *)0x0);
    if (((this->AT_data).data != (void *)0x0) &&
       ((long)(this->AT_data).c * (this->AT_data).cstep != 0)) {
      iVar14 = 0;
      local_5c = iVar18;
      if (iVar18 < 1) {
        local_5c = 0;
      }
      while (opt = local_48, iVar14 != local_5c) {
        iVar11 = (int)local_40;
        iVar16 = iVar11 * iVar14;
        iVar18 = (int)local_38 - iVar16;
        if (iVar11 < iVar18) {
          iVar18 = iVar11;
        }
        local_68 = (ulong)iVar14;
        local_58 = iVar14;
        iVar14 = iVar7;
        for (iVar11 = 0; iVar11 < iVar7; iVar11 = iVar11 + iVar5) {
          iVar13 = iVar14;
          if (iVar5 < iVar14) {
            iVar13 = iVar5;
          }
          local_b8.w = (this->AT_data).w;
          local_b8.cstep = (size_t)local_b8.w;
          local_b8.elemsize = (this->AT_data).elemsize;
          local_b8.elempack = (this->AT_data).elempack;
          local_b8.allocator = (this->AT_data).allocator;
          local_b8.data =
               (void *)((long)(this->AT_data).data +
                       local_b8.elemsize * local_b8.cstep * (long)(iVar11 / iVar5) +
                       (this->AT_data).cstep * local_68 * local_b8.elemsize);
          local_b8.refcount._0_4_ = 0;
          local_b8.refcount._4_4_ = 0;
          local_b8.dims = 2;
          local_b8.h = 1;
          local_b8.d = 1;
          local_b8.c = 1;
          if (*(int *)(this->_vptr_Gemm_x86_fma[-3] + 0x38 + (long)&(this->CT_data).data) == 0) {
            pack_A_tile((Mat *)(&this->field_0x118 + (long)this->_vptr_Gemm_x86_fma[-3]),&local_b8,
                        iVar16,iVar18,iVar11,iVar13);
          }
          else {
            transpose_pack_A_tile
                      ((Mat *)(&this->field_0x118 + (long)this->_vptr_Gemm_x86_fma[-3]),&local_b8,
                       iVar16,iVar18,iVar11,iVar13);
          }
          iVar14 = iVar14 - iVar5;
        }
        iVar14 = local_58 + 1;
      }
      pp_Var10 = this->_vptr_Gemm_x86_fma;
      if (local_48->lightmode != false) {
        p_Var17 = pp_Var10[-3];
        piVar9 = *(int **)(&this->field_0x120 + (long)p_Var17);
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + -1;
          UNLOCK();
          if (*piVar9 == 0) {
            if (*(long **)(&this->field_0x138 + (long)p_Var17) == (long *)0x0) {
              free(*(void **)(&this->field_0x118 + (long)p_Var17));
            }
            else {
              (**(code **)(**(long **)(&this->field_0x138 + (long)p_Var17) + 0x18))();
            }
          }
        }
        *(undefined8 *)(&this->field_0x158 + (long)p_Var17) = 0;
        *(undefined8 *)(&this->field_0x124 + (long)p_Var17) = 0;
        *(undefined8 *)(&this->field_0x12c + (long)p_Var17) = 0;
        *(undefined8 *)(&this->field_0x118 + (long)p_Var17) = 0;
        *(undefined8 *)(&this->field_0x120 + (long)p_Var17) = 0;
        *(undefined8 *)(&this->field_0x140 + (long)p_Var17) = 0;
        *(undefined8 *)(&this->field_0x148 + (long)p_Var17) = 0;
        *(undefined4 *)(&this->field_0x150 + (long)p_Var17) = 0;
        pp_Var10 = this->_vptr_Gemm_x86_fma;
      }
      p_Var17 = pp_Var10[-3];
      goto LAB_00467cc2;
    }
LAB_00467e82:
    iVar7 = -100;
  }
  return iVar7;
}

Assistant:

int Gemm_x86_fma::create_pipeline(const Option& opt)
{
    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

        AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
        {
            A_data.release();
        }
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;
        const int nn_K = (K + TILE_K - 1) / TILE_K;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        const int nn_NK = nn_N * nn_K;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

            if (transB)
            {
                pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
            else
            {
                transpose_pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
        }

        if (opt.lightmode)
        {
            B_data.release();
        }
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

#if __SSE2__
        if (constant_broadcast_type_C == 3 && opt.use_packing_layout)
        {
#if __AVX512F__
            int C_elempack = constantM % 16 == 0 ? 16 : constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#elif __AVX__
            int C_elempack = constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#else
            int C_elempack = constantM % 4 == 0 ? 4 : 1;
#endif
            convert_packing(C_data, CT_data, C_elempack, opt);
        }
#endif // __SSE2__

        // pre-multiply C with beta
        if (beta != 1.f)
        {
            Mat C2;
            C2.create_like(CT_data);

            const int size = CT_data.total() * CT_data.elempack;
            for (int i = 0; i < size; i++)
            {
                C2[i] = CT_data[i] * beta;
            }

            CT_data = C2;
        }

        if (opt.lightmode)
        {
            C_data.release();
        }
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}